

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O1

void __thiscall expr_tree::subSimplifs(expr_tree *this,expr_node *node)

{
  expr_node **ppeVar1;
  expr_node *peVar2;
  expr_node *this_00;
  bool bVar3;
  
  ppeVar1 = &node->left;
  bVar3 = IsZero(node->left);
  if (bVar3) {
    peVar2 = *ppeVar1;
    if (peVar2 != (expr_node *)0x0) {
      expr_node::~expr_node(peVar2);
      operator_delete(peVar2,0x28);
    }
    *ppeVar1 = (expr_node *)0x0;
  }
  else {
    bVar3 = IsZero(node->right);
    if (bVar3) {
      peVar2 = node->left;
      this_00 = node->right;
      if (peVar2 != (expr_node *)0x0) {
        if (this_00 != (expr_node *)0x0) {
          expr_node::~expr_node(this_00);
          operator_delete(this_00,0x28);
        }
        node->type = peVar2->type;
        node->value = peVar2->value;
        Link(node,peVar2->left,peVar2->right);
        peVar2->left = (expr_node *)0x0;
        peVar2->right = (expr_node *)0x0;
        expr_node::~expr_node(peVar2);
        operator_delete(peVar2,0x28);
        return;
      }
      if (this_00 != (expr_node *)0x0) {
        expr_node::~expr_node(this_00);
        operator_delete(this_00,0x28);
      }
      *ppeVar1 = (expr_node *)0x0;
      node->right = (expr_node *)0x0;
      node->type = '\x01';
      (node->value).integer = 0;
    }
  }
  return;
}

Assistant:

void expr_tree::subSimplifs(expr_node* node)
{
    if (IsZero(node->left)) {
        delete node->left;
        node->left = nullptr;
    } else if (IsZero(node->right)) {
        if (node->left == nullptr) {// Unary minus
            delete node->right;
            node->right = node->left = nullptr;
            node->type = INT;
            node->value.integer = 0;
        } else {
            expr_node* tmp = node->left;
            delete node->right;
            node->type = tmp->type;
            node->value = tmp->value;
            Link(node, tmp->left, tmp->right);
            tmp->left = tmp->right = nullptr;
            delete tmp;
        }
    }
}